

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_module.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseModule(Parser *this)

{
  Token *tokId;
  Token *pTVar1;
  size_t sVar2;
  Lexer *pLVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  Lexer *this_00;
  Parser *in_RSI;
  pointer __p;
  ModBody body;
  _Head_base<0UL,_pfederc::ModExpr_*,_false> local_90;
  undefined1 local_88 [8];
  Error<pfederc::SyntaxErrorCode> *local_80;
  Exprs local_78;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_60;
  undefined1 local_40 [16];
  
  sanityExpect(in_RSI,TOK_KW_MOD);
  tokId = in_RSI->lexer->currentToken;
  bVar6 = expect(in_RSI,TOK_ID);
  if (!bVar6) {
    pTVar1 = in_RSI->lexer->currentToken;
    local_80 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar4 = (pTVar1->pos).line;
    sVar5 = (pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    local_80->logLevel = LVL_ERROR;
    local_80->err = STX_ERR_EXPECTED_ID;
    (local_80->pos).line = sVar4;
    (local_80->pos).startIndex = sVar5;
    (local_80->pos).endIndex = sVar2;
    (local_80->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)(local_40 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_40 + 8));
    if (local_80 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_80,local_80);
    }
  }
  bVar7 = expect(in_RSI,TOK_EOL);
  if (!bVar7) {
    pTVar1 = in_RSI->lexer->currentToken;
    local_80 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar4 = (pTVar1->pos).line;
    sVar5 = (pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    local_80->logLevel = LVL_ERROR;
    local_80->err = STX_ERR_EXPECTED_EOL;
    (local_80->pos).line = sVar4;
    (local_80->pos).startIndex = sVar5;
    (local_80->pos).endIndex = sVar2;
    (local_80->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_80->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_80->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)local_40,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_40)
    ;
    if (local_80 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_80,local_80);
    }
  }
  parseModBody((ModBody *)&local_80,in_RSI,false);
  bVar7 = expect(in_RSI,TOK_STMT);
  if (!bVar7) {
    pTVar1 = in_RSI->lexer->currentToken;
    local_90._M_head_impl = (ModExpr *)operator_new(0x38);
    sVar4 = (pTVar1->pos).line;
    pLVar3 = (Lexer *)(pTVar1->pos).startIndex;
    sVar2 = (pTVar1->pos).endIndex;
    *(Level *)&((local_90._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((local_90._M_head_impl)->super_Expr)._vptr_Expr + 4) =
         STX_ERR_EXPECTED_STMT;
    ((Position *)&((local_90._M_head_impl)->super_Expr).parent)->line = sVar4;
    ((local_90._M_head_impl)->super_Expr).lexer = pLVar3;
    *(size_t *)&((local_90._M_head_impl)->super_Expr).type = sVar2;
    (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
     &((local_90._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((local_90._M_head_impl)->super_Expr).pos.startIndex = 0;
    ((local_90._M_head_impl)->super_Expr).pos.endIndex = 0;
    generateError((Parser *)local_88,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_88)
    ;
    if (local_90._M_head_impl != (ModExpr *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_90,
                 (Error<pfederc::SyntaxErrorCode> *)local_90._M_head_impl);
    }
  }
  if (bVar6) {
    pLVar3 = in_RSI->lexer;
    this_00 = (Lexer *)operator_new(0x58);
    ModExpr::ModExpr((ModExpr *)this_00,pLVar3,&tokId->pos,tokId,&local_78);
    local_90._M_head_impl = (ModExpr *)0x0;
    this->lexer = this_00;
    std::unique_ptr<pfederc::ModExpr,_std::default_delete<pfederc::ModExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ModExpr,_std::default_delete<pfederc::ModExpr>_> *)&local_90);
  }
  else {
    this->lexer = (Lexer *)0x0;
  }
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector(&local_78);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseModule() noexcept {
  sanityExpect(TokenType::TOK_KW_MOD);
  
  bool err = false;

  const Token *tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    // soft error
  }

  ModBody body = parseModBody();
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
    // soft error
  }

  if (err)
    return nullptr;
 
  return std::make_unique<ModExpr>(lexer, tokId->getPosition(), tokId,
    std::move(std::get<2>(body)));
}